

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

string * __thiscall CSubNet::ToString_abi_cxx11_(CSubNet *this)

{
  int iVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  size_t i;
  uint8_t cidr;
  string suffix;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  size_type in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  CNetAddr *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  string *this_00;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  __str = in_RSI;
  this_00 = in_RDI;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  iVar1 = *(int *)((long)&in_RSI->field_2 + 8);
  if ((iVar1 != 0) && (iVar1 - 1U < 2)) {
    in_stack_ffffffffffffff44 =
         prevector<16U,_unsigned_char,_unsigned_int,_int>::size
                   ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)in_stack_ffffffffffffff38);
    if (0x10 < in_stack_ffffffffffffff44) {
      __assert_fail("network.m_addr.size() <= sizeof(netmask)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                    ,0x420,"std::string CSubNet::ToString() const");
    }
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    while ((in_stack_ffffffffffffff38 = local_98,
           in_stack_ffffffffffffff40 =
                prevector<16U,_unsigned_char,_unsigned_int,_int>::size
                          ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_98),
           in_stack_ffffffffffffff38 <
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)in_stack_ffffffffffffff40 &&
           (*(char *)((long)&in_RSI[1]._M_dataplus._M_p + (long)&(local_98->_M_dataplus)._M_p) !=
            '\0'))) {
      NetmaskBits((uint8_t)((uint)in_stack_ffffffffffffff28 >> 0x18));
      local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(local_98->_M_dataplus)._M_p + 1);
    }
    tinyformat::format<unsigned_char>((char *)in_RSI,(uchar *)in_RDI);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,__str);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  }
  CNetAddr::ToStringAddr_abi_cxx11_(in_stack_ffffffffffffff70);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff38);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string CSubNet::ToString() const
{
    std::string suffix;

    switch (network.m_net) {
    case NET_IPV4:
    case NET_IPV6: {
        assert(network.m_addr.size() <= sizeof(netmask));

        uint8_t cidr = 0;

        for (size_t i = 0; i < network.m_addr.size(); ++i) {
            if (netmask[i] == 0x00) {
                break;
            }
            cidr += NetmaskBits(netmask[i]);
        }

        suffix = strprintf("/%u", cidr);
        break;
    }
    case NET_ONION:
    case NET_I2P:
    case NET_CJDNS:
    case NET_INTERNAL:
    case NET_UNROUTABLE:
    case NET_MAX:
        break;
    }

    return network.ToStringAddr() + suffix;
}